

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_data_converter_config *
ma_data_converter_config_init
          (ma_format formatIn,ma_format formatOut,ma_uint32 channelsIn,ma_uint32 channelsOut,
          ma_uint32 sampleRateIn,ma_uint32 sampleRateOut)

{
  ma_uint32 in_ECX;
  ma_format in_EDX;
  ma_format in_ESI;
  ma_data_converter_config *in_RDI;
  ma_uint32 in_R8D;
  ma_uint32 in_R9D;
  ma_data_converter_config *config;
  ma_uint32 in_stack_00000008;
  
  ma_data_converter_config_init_default();
  in_RDI->formatIn = in_ESI;
  in_RDI->formatOut = in_EDX;
  in_RDI->channelsIn = in_ECX;
  in_RDI->channelsOut = in_R8D;
  in_RDI->sampleRateIn = in_R9D;
  in_RDI->sampleRateOut = in_stack_00000008;
  return in_RDI;
}

Assistant:

MA_API ma_data_converter_config ma_data_converter_config_init(ma_format formatIn, ma_format formatOut, ma_uint32 channelsIn, ma_uint32 channelsOut, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut)
{
    ma_data_converter_config config = ma_data_converter_config_init_default();
    config.formatIn      = formatIn;
    config.formatOut     = formatOut;
    config.channelsIn    = channelsIn;
    config.channelsOut   = channelsOut;
    config.sampleRateIn  = sampleRateIn;
    config.sampleRateOut = sampleRateOut;

    return config;
}